

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_anyNotEqual_ivec3(ShaderEvalContext *c)

{
  bool bVar1;
  int i;
  long lVar2;
  bool bVar3;
  Vector<int,_3> res_1;
  Vector<int,_3> res;
  float local_18 [3];
  undefined8 local_c;
  float local_4;
  
  local_18[0] = c->in[0].m_data[2];
  local_18[1] = c->in[0].m_data[0];
  local_18[2] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c = *(undefined8 *)(c->in[1].m_data + 1);
  local_4 = c->in[1].m_data[0];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (int)*(float *)((long)&local_c + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  bVar3 = false;
  do {
    bVar1 = !bVar3;
    bVar3 = true;
    if (bVar1) {
      bVar3 = res.m_data[lVar2] != res_1.m_data[lVar2];
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (c->color).m_data[0] = (float)bVar3;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }